

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
          (LoadStoreMachine *this,GLenum internalformat,Vector<int,_4> *write_value,
          Vector<int,_4> *expected_value)

{
  CallLogWrapper *pCVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  GLuint GVar4;
  GLint GVar5;
  uint uVar6;
  char *pcVar7;
  GLenum GVar8;
  undefined *puVar9;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  ivec4 *b;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  ivec4 *extraout_RDX;
  ivec4 *extraout_RDX_00;
  Vector<int,_4> *v_01;
  Vector<int,_4> *v_02;
  ivec4 *extraout_RDX_01;
  ivec4 *b_00;
  Vector<float,_4> *v_03;
  long lVar10;
  int iVar11;
  GLenum GVar12;
  Vector<int,_4> *in_R8;
  Vector<int,_4> *pVVar13;
  _Alloc_hider _Var14;
  int i;
  string *this_00;
  bool bVar15;
  int iVar16;
  GLenum *pGVar17;
  long lVar18;
  bool bVar19;
  GLuint local_1fc;
  GLuint local_1f0;
  GLuint texture_result;
  GLuint textures [8];
  string local_1b0;
  vec4 color;
  string source;
  Vector<int,_4> data;
  Vector<float,_4> local_80;
  Vector<int,_4> local_70;
  Vector<int,_4> local_60;
  Vector<int,_4> local_50;
  Vector<int,_4> local_40;
  
  GVar8 = (GLenum)write_value;
  GVar12 = (GLenum)expected_value;
  switch(*(undefined4 *)(this + 0x2c)) {
  case 0:
    GenStoreShader<tcu::Vector<int,4>>(&source,(LoadStoreMachine *)0x0,internalformat,GVar8,in_R8);
    pVVar13 = (Vector<int,_4> *)0x0;
    local_1fc = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,source._M_dataplus._M_p,(char *)0x0,
                           (char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&source);
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar12,
               pVVar13);
    local_1f0 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,source._M_dataplus._M_p,(char *)0x0,
                           (char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case 1:
    GenStoreShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)&DAT_00000001,internalformat,GVar8,in_R8);
    pVVar13 = (Vector<int,_4> *)0x0;
    local_1fc = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           source._M_dataplus._M_p,
                           "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                           (char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&source);
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar12,
               pVVar13);
    local_1f0 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           source._M_dataplus._M_p,
                           "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                           (char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case 2:
    GenStoreShader<tcu::Vector<int,4>>(&source,(LoadStoreMachine *)0x2,internalformat,GVar8,in_R8);
    pVVar13 = (Vector<int,_4> *)0x0;
    local_1fc = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&source);
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar12,
               pVVar13);
    local_1f0 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
    break;
  case 3:
    GenStoreShader<tcu::Vector<int,4>>(&source,(LoadStoreMachine *)0x3,internalformat,GVar8,in_R8);
    _Var14 = source._M_dataplus;
    local_1fc = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,(char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&source);
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar12,
               (Vector<int,_4> *)_Var14._M_p);
    local_1f0 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                          ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                           (char *)0x0,(char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
    break;
  case 4:
    GenStoreShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)&DAT_00000004,internalformat,GVar8,in_R8);
    textures._0_8_ = source._M_dataplus._M_p;
    pCVar1 = (CallLogWrapper *)(this + 8);
    GVar4 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
    pVVar13 = (Vector<int,_4> *)0x0;
    glu::CallLogWrapper::glShaderSource(pCVar1,GVar4,1,(GLchar **)textures,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(pCVar1,GVar4);
    local_1fc = glu::CallLogWrapper::glCreateProgram(pCVar1);
    glu::CallLogWrapper::glAttachShader(pCVar1,local_1fc,GVar4);
    glu::CallLogWrapper::glLinkProgram(pCVar1,local_1fc);
    glu::CallLogWrapper::glDeleteShader(pCVar1,GVar4);
    std::__cxx11::string::~string((string *)&source);
    GenLoadShader<tcu::Vector<int,4>>
              (&source,(LoadStoreMachine *)(ulong)*(uint *)(this + 0x2c),internalformat,GVar12,
               pVVar13);
    textures._0_8_ = source._M_dataplus._M_p;
    GVar4 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
    glu::CallLogWrapper::glShaderSource(pCVar1,GVar4,1,(GLchar **)textures,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(pCVar1,GVar4);
    local_1f0 = glu::CallLogWrapper::glCreateProgram(pCVar1);
    glu::CallLogWrapper::glAttachShader(pCVar1,local_1f0,GVar4);
    glu::CallLogWrapper::glLinkProgram(pCVar1,local_1f0);
    glu::CallLogWrapper::glDeleteShader(pCVar1,GVar4);
    std::__cxx11::string::~string((string *)&source);
    goto LAB_00a4c9e4;
  default:
    local_1f0 = 0;
    local_1fc = 0;
    goto LAB_00a4c9e4;
  }
  std::__cxx11::string::~string((string *)&source);
LAB_00a4c9e4:
  pCVar1 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(pCVar1,8,textures);
  glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
  pGVar17 = &DAT_016ca090;
  for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
    GVar8 = *pGVar17;
    glu::CallLogWrapper::glBindTexture(pCVar1,GVar8,textures[lVar18]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,GVar8,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,GVar8,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage1D(pCVar1,0xde0,1,internalformat,1);
    pGVar17 = pGVar17 + 1;
  }
  glu::CallLogWrapper::glBindImageTexture(pCVar1,0,textures[0],0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[1],0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[2],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[3],0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[4],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[5],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[6],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[7],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glUseProgram(pCVar1,local_1fc);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1fc,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,0);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1fc,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,1);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1fc,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,2);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1fc,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,3);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1fc,"g_image_cube");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,4);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1fc,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,5);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1fc,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,6);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1fc,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,7);
  glu::CallLogWrapper::glBindVertexArray(pCVar1,*(GLuint *)(this + 0x28));
  if (*(int *)(this + 0x2c) - 1U < 2) {
    glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
    glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
    glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
  }
  else if (*(int *)(this + 0x2c) == 4) {
    glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
  }
  else {
    glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
  }
  bVar15 = true;
  for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
    GVar8 = (&DAT_016ca090)[lVar18];
    glu::CallLogWrapper::glBindTexture(pCVar1,GVar8,textures[lVar18]);
    glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
    if (lVar18 == 4) {
      iVar11 = 0;
      iVar16 = 6;
      while (bVar19 = iVar16 != 0, iVar16 = iVar16 + -1, bVar19) {
        tcu::Vector<int,_4>::Vector(&data);
        GVar12 = 0x8d99;
        glu::CallLogWrapper::glGetTexImage
                  (pCVar1,iVar11 + 0x8515,0,0x8d99,0x1404,(ShaderImageLoadStoreBase *)&data);
        bVar19 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                           ((ShaderImageLoadStoreBase *)&data,expected_value,b,GVar12);
        if (!bVar19) {
          tcu::Vector<int,_4>::Vector(&local_40,&data);
          ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&source,&local_40,v);
          _Var3 = source._M_dataplus;
          tcu::Vector<int,_4>::Vector(&local_50,expected_value);
          ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_1b0,&local_50,v_00);
          _Var14._M_p = local_1b0._M_dataplus._M_p;
          GVar12 = internalformat;
          ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                    ((string *)&color,(void *)(ulong)internalformat,e);
          gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
                    ((ShaderImageLoadStoreBase *)(ulong)GVar8,GVar12);
          gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                    ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),GVar12);
          gl4cts::anon_unknown_0::Output
                    ("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n"
                     ,_Var3._M_p,_Var14._M_p);
          std::__cxx11::string::~string((string *)&color);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&source);
          bVar15 = false;
        }
        iVar11 = iVar11 + 1;
      }
    }
    else {
      lVar10 = 0;
      do {
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)((long)&source._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0xc0);
      memset(&source,0,0xc0);
      puVar9 = (undefined *)0x8d99;
      glu::CallLogWrapper::glGetTexImage(pCVar1,GVar8,0,0x8d99,0x1404,&source);
      uVar6 = (int)lVar18 - 2;
      lVar10 = 1;
      if (uVar6 < 6) {
        puVar9 = &DAT_016ba018;
        lVar10 = *(long *)(&DAT_016ba018 + (ulong)uVar6 * 8);
      }
      this_00 = &source;
      b_00 = extraout_RDX;
      while (bVar19 = lVar10 != 0, lVar10 = lVar10 + -1, bVar19) {
        bVar19 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                           ((ShaderImageLoadStoreBase *)this_00,expected_value,b_00,(GLenum)puVar9);
        b_00 = extraout_RDX_00;
        if (!bVar19) {
          tcu::Vector<int,_4>::Vector(&local_60,(Vector<int,_4> *)this_00);
          ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_1b0,&local_60,v_01);
          _Var14._M_p = local_1b0._M_dataplus._M_p;
          tcu::Vector<int,_4>::Vector(&local_70,expected_value);
          ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>((string *)&color,&local_70,v_02);
          uVar2 = color.m_data._0_8_;
          GVar12 = internalformat;
          ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                    ((string *)&data,(void *)(ulong)internalformat,e_00);
          puVar9 = (undefined *)data.m_data._0_8_;
          gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
                    ((ShaderImageLoadStoreBase *)(ulong)GVar8,GVar12);
          gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                    ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),GVar12);
          gl4cts::anon_unknown_0::Output
                    ("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n"
                     ,_Var14._M_p,uVar2);
          std::__cxx11::string::~string((string *)&data);
          std::__cxx11::string::~string((string *)&color);
          std::__cxx11::string::~string((string *)&local_1b0);
          bVar15 = false;
          b_00 = extraout_RDX_01;
        }
        this_00 = (string *)&this_00->field_2;
      }
    }
  }
  glu::CallLogWrapper::glBindImageTexture(pCVar1,0,texture_result,0,'\0',0,0x88b9,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[1],0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[2],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[3],0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[4],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[5],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[6],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[7],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glUseProgram(pCVar1,local_1f0);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1f0,"g_image_result");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,0);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1f0,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,1);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1f0,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,2);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1f0,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,3);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1f0,"g_image_cube");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,4);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1f0,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,5);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1f0,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,6);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,local_1f0,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar5,7);
  if (*(int *)(this + 0x2c) - 1U < 2) {
    glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
    glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
    glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
  }
  else if (*(int *)(this + 0x2c) == 4) {
    glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
  }
  else {
    glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
  }
  tcu::Vector<float,_4>::Vector(&color);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
  glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
  glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x1908,0x1406,&color);
  source._M_dataplus._M_p = (pointer)0x3f80000000000000;
  source._M_string_length = 0x3f80000000000000;
  bVar19 = tcu::allEqual<float,4>(&color,(Vector<float,_4> *)&source);
  if (!bVar19) {
    tcu::Vector<float,_4>::Vector(&local_80,&color);
    ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&source,&local_80,v_03);
    _Var14 = source._M_dataplus;
    ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_1b0,(void *)(ulong)internalformat,e_01);
    pcVar7 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                       ((ShaderImageLoadStoreBase *)(ulong)*(uint *)(this + 0x2c),internalformat);
    gl4cts::anon_unknown_0::Output
              ("Color is: %s. Format is: %s. Stage is: %s.\n",_Var14._M_p,local_1b0._M_dataplus._M_p
               ,pcVar7);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&source);
    bVar15 = false;
  }
  glu::CallLogWrapper::glUseProgram(pCVar1,0);
  glu::CallLogWrapper::glDeleteProgram(pCVar1,local_1fc);
  glu::CallLogWrapper::glDeleteProgram(pCVar1,local_1f0);
  glu::CallLogWrapper::glDeleteTextures(pCVar1,8,textures);
  glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
  return bVar15;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLenum targets[] = { GL_TEXTURE_1D,		GL_TEXTURE_2D,
								   GL_TEXTURE_3D,		GL_TEXTURE_RECTANGLE,
								   GL_TEXTURE_CUBE_MAP, GL_TEXTURE_1D_ARRAY,
								   GL_TEXTURE_2D_ARRAY, GL_TEXTURE_CUBE_MAP_ARRAY };
		const int kTargets		= sizeof(targets) / sizeof(targets[0]);
		GLuint	program_store = 0;
		GLuint	program_load  = 0;
		if (m_stage == 0)
		{ // VS
			program_store =
				BuildProgram(GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL, NULL, NULL);
			program_load =
				BuildProgram(GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL, NULL, NULL);
		}
		else if (m_stage == 1)
		{ // TCS
			const char* const glsl_vs  = "#version 420 core" NL "void main() {}";
			const char* const glsl_tes = "#version 420 core" NL "layout(quads, point_mode) in;" NL "void main() {}";
			program_store = BuildProgram(glsl_vs, GenStoreShader(m_stage, internalformat, write_value).c_str(),
										 glsl_tes, NULL, NULL);
			program_load = BuildProgram(glsl_vs, GenLoadShader(m_stage, internalformat, expected_value).c_str(),
										glsl_tes, NULL, NULL);
		}
		else if (m_stage == 2)
		{ // TES
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL);
		}
		else if (m_stage == 3)
		{ // GS
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL);
		}
		else if (m_stage == 4)
		{ // CS
			{
				std::string		  source = GenStoreShader(m_stage, internalformat, write_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_store = glCreateProgram();
				glAttachShader(program_store, sh);
				glLinkProgram(program_store);
				glDeleteShader(sh);
			}
			{
				std::string		  source = GenLoadShader(m_stage, internalformat, expected_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_load = glCreateProgram();
				glAttachShader(program_load, sh);
				glLinkProgram(program_load);
				glDeleteShader(sh);
			}
		}
		GLuint textures[kTargets], texture_result;
		glGenTextures(kTargets, textures);
		glGenTextures(1, &texture_result);

		glBindTexture(GL_TEXTURE_2D, texture_result);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, 1, 1);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (targets[i] == GL_TEXTURE_1D)
			{
				glTexStorage1D(targets[i], 1, internalformat, 1);
			}
			else if (targets[i] == GL_TEXTURE_2D || targets[i] == GL_TEXTURE_RECTANGLE)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 12);
			}
			else if (targets[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 2);
			}
		}
		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program_store);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_store, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube_array"), 7);

		glBindVertexArray(m_vao);
		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}

		bool status = true;
		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

			if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				for (int face = 0; face < 6; ++face)
				{
					T data;
					glGetTexImage(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, Format<T>(), Type<T>(), &data[0]);
					if (!Equal(data, expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
			else
			{
				T data[12];
				memset(&data[0], 0, sizeof(data));
				glGetTexImage(targets[i], 0, Format<T>(), Type<T>(), &data[0]);

				int count = 1;
				if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
					count = 2;
				else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
					count = 12;
				else if (targets[i] == GL_TEXTURE_1D_ARRAY)
					count = 2;

				for (int j = 0; j < count; ++j)
				{
					if (!Equal(data[j], expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data[j]).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
		}
		glBindImageTexture(0, texture_result, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);

		glUseProgram(program_load);
		glUniform1i(glGetUniformLocation(program_load, "g_image_result"), 0);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_load, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_load, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube_array"), 7);

		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}
		{
			vec4 color;
			glBindTexture(GL_TEXTURE_2D, texture_result);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &color[0]);
			if (!tcu::allEqual(color, vec4(0, 1, 0, 1)))
			{
				status = false;
				Output("Color is: %s. Format is: %s. Stage is: %s.\n", ToString(color).c_str(),
					   FormatEnumToString(internalformat).c_str(), StageName(m_stage));
			}
		}
		glUseProgram(0);
		glDeleteProgram(program_store);
		glDeleteProgram(program_load);
		glDeleteTextures(kTargets, textures);
		glDeleteTextures(1, &texture_result);
		return status;
	}